

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

CompileInfo * __thiscall cmGeneratorTarget::GetCompileInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_bool>
  pVar5;
  allocator<char> local_b1;
  string msg;
  value_type entry;
  string config_upper;
  
  bVar1 = IsImported(this);
  if (!bVar1) {
    TVar2 = GetType(this);
    if ((int)TVar2 < 5) {
      config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
      config_upper._M_string_length = 0;
      config_upper.field_2._M_local_buf[0] = '\0';
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&entry.first,config);
        std::__cxx11::string::operator=((string *)&config_upper,(string *)&entry);
        std::__cxx11::string::~string((string *)&entry);
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
              ::find(&(this->CompileInfoMap)._M_t,&config_upper);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string<std::allocator<char>>((string *)&entry,"COMPILE_PDB",&local_b1)
        ;
        ComputePDBOutputDir(this,&entry.first,config,&msg);
        std::__cxx11::string::~string((string *)&entry);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::CompileInfo_&,_true>
                  (&entry,&config_upper,(CompileInfo *)&msg);
        pVar5 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                ::
                _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                            *)&this->CompileInfoMap,&entry);
        iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::~pair(&entry);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::__cxx11::string::~string((string *)&config_upper);
      return (CompileInfo *)(iVar4._M_node + 2);
    }
    entry.first._M_dataplus._M_p = (pointer)0x24;
    entry.first._M_string_length = (size_type)anon_var_dwarf_15fa321;
    psVar3 = GetName_abi_cxx11_(this);
    config_upper._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    config_upper._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    TVar2 = GetType(this);
    psVar3 = cmState::GetTargetTypeName_abi_cxx11_(TVar2);
    cmStrCat<char[17],std::__cxx11::string>
              (&msg,(cmAlphaNum *)&entry,(cmAlphaNum *)&config_upper,
               (char (*) [17])" which has type ",psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (CompileInfo *)0x0;
}

Assistant:

cmGeneratorTarget::CompileInfo const* cmGeneratorTarget::GetCompileInfo(
  const std::string& config) const
{
  // There is no compile information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  if (this->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    std::string msg = cmStrCat("cmTarget::GetCompileInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->CompileInfoMap.find(config_upper);
  if (i == this->CompileInfoMap.end()) {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->CompileInfoMap.insert(entry).first;
  }
  return &i->second;
}